

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O3

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::BordersTestLarge_TestEncodeHighBitrate_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::BordersTestLarge_TestEncodeHighBitrate_Test>
           *this)

{
  BordersTestLarge *this_00;
  
  WithParamInterface<std::tuple<libaom_test::CodecFactory_const*,libaom_test::TestMode>>::parameter_
       = &this->parameter_;
  this_00 = (BordersTestLarge *)operator_new(0x3f8);
  anon_unknown.dwarf_13268d1::BordersTestLarge::BordersTestLarge(this_00);
  (this_00->super_CodecTestWithParam<libaom_test::TestMode>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode>_>.
  super_Test._vptr_Test = (_func_int **)&PTR__BordersTestLarge_0102a4f0;
  (this_00->super_CodecTestWithParam<libaom_test::TestMode>).
  super_TestWithParam<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode>_>.
  super_WithParamInterface<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode>_>.
  _vptr_WithParamInterface =
       (_func_int **)&PTR__BordersTestLarge_TestEncodeHighBitrate_Test_0102a540;
  (this_00->super_EncoderTest)._vptr_EncoderTest =
       (_func_int **)&PTR__BordersTestLarge_TestEncodeHighBitrate_Test_0102a560;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }